

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaintype.cpp
# Opt level: O2

optional<ChainType> ChainTypeFromString(string_view chain)

{
  long lVar1;
  bool bVar2;
  ulong uVar3;
  long in_FS_OFFSET;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_01;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_02;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y_03;
  ulong uStack_30;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 0x100000000;
  __y._M_str = "main";
  __y._M_len = 4;
  bVar2 = std::operator==(chain,__y);
  if (bVar2) {
    uStack_30 = 0;
  }
  else {
    uStack_30 = 4;
    __y_00._M_str = "test";
    __y_00._M_len = 4;
    bVar2 = std::operator==(chain,__y_00);
    if (bVar2) {
      uStack_30 = 1;
    }
    else {
      __y_01._M_str = "testnet4";
      __y_01._M_len = 8;
      bVar2 = std::operator==(chain,__y_01);
      if (!bVar2) {
        __y_02._M_str = "signet";
        __y_02._M_len = 6;
        bVar2 = std::operator==(chain,__y_02);
        if (bVar2) {
          uStack_30 = 2;
        }
        else {
          __y_03._M_str = "regtest";
          __y_03._M_len = 7;
          bVar2 = std::operator==(chain,__y_03);
          if (!bVar2) {
            uVar3 = 0;
          }
          uStack_30 = 3;
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (_Optional_base<ChainType,_true,_true>)
         (_Optional_base<ChainType,_true,_true>)(uVar3 | uStack_30);
}

Assistant:

std::optional<ChainType> ChainTypeFromString(std::string_view chain)
{
    if (chain == "main") {
        return ChainType::MAIN;
    } else if (chain == "test") {
        return ChainType::TESTNET;
    } else if (chain == "testnet4") {
        return ChainType::TESTNET4;
    } else if (chain == "signet") {
        return ChainType::SIGNET;
    } else if (chain == "regtest") {
        return ChainType::REGTEST;
    } else {
        return std::nullopt;
    }
}